

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_impl.h
# Opt level: O2

int simd_test_avx2::V64_V64_avx2_TestIntrinsics_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<simd_test_avx2::TestIntrinsic<std::tuple<unsigned_int,_unsigned_int,_const_char_*>_>_>
  *this_01;
  TestMetaFactoryBase<std::tuple<unsigned_int,_unsigned_int,_const_char_*>_> *meta_factory;
  allocator local_a2;
  allocator local_a1;
  string local_a0 [32];
  CodeLocation local_80;
  CodeLocation local_58;
  string local_30 [32];
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::__cxx11::string::string
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/simd_impl.h"
             ,&local_a1);
  std::__cxx11::string::string((string *)&local_58,local_30);
  local_58.line = 0x85;
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<simd_test_avx2::TestIntrinsic<std::tuple<unsigned_int,unsigned_int,char_const*>>>
                      (this_00,"V64_V64_avx2",&local_58);
  meta_factory = (TestMetaFactoryBase<std::tuple<unsigned_int,_unsigned_int,_const_char_*>_> *)
                 operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)&PTR__TestMetaFactoryBase_00f13ce8;
  std::__cxx11::string::string
            (local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/simd_impl.h"
             ,&local_a2);
  std::__cxx11::string::string((string *)&local_80,local_a0);
  local_80.line = 0x85;
  testing::internal::
  ParameterizedTestSuiteInfo<simd_test_avx2::TestIntrinsic<std::tuple<unsigned_int,_unsigned_int,_const_char_*>_>_>
  ::AddTestPattern(this_01,"V64_V64_avx2","TestIntrinsics",meta_factory,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

MY_TEST_P(ARCH_POSTFIX(V64_V64), TestIntrinsics) {
  TestSimd1Arg<c_v64, c_v64>(kIterations, mask, maskwidth, name);
}